

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cni.hpp
# Opt level: O0

void __thiscall
cs_impl::
cni_holder<void_(*)(const_std::shared_ptr<cs_impl::runtime_cs_ext::fiber_holder_impl>_&),_void_(*)(const_std::shared_ptr<cs_impl::runtime_cs_ext::fiber_holder_impl>_&)>
::cni_holder(cni_holder<void_(*)(const_std::shared_ptr<cs_impl::runtime_cs_ext::fiber_holder_impl>_&),_void_(*)(const_std::shared_ptr<cs_impl::runtime_cs_ext::fiber_holder_impl>_&)>
             *this,_func_void_shared_ptr<cs_impl::runtime_cs_ext::fiber_holder_impl>_ptr **func)

{
  function<void_(const_std::shared_ptr<cs_impl::runtime_cs_ext::fiber_holder_impl>_&)> *in_RDI;
  cni_helper<void_(*)(const_std::shared_ptr<cs_impl::runtime_cs_ext::fiber_holder_impl>_&),_void_(*)(const_std::shared_ptr<cs_impl::runtime_cs_ext::fiber_holder_impl>_&)>
  *this_00;
  function<void_(const_std::shared_ptr<cs_impl::runtime_cs_ext::fiber_holder_impl>_&)>
  *in_stack_ffffffffffffffc0;
  _func_void_shared_ptr<cs_impl::runtime_cs_ext::fiber_holder_impl>_ptr *local_30 [6];
  
  cni_holder_base::cni_holder_base((cni_holder_base *)in_RDI);
  *(undefined ***)&(in_RDI->super__Function_base)._M_functor = &PTR__cni_holder_003e4dc0;
  this_00 = (cni_helper<void_(*)(const_std::shared_ptr<cs_impl::runtime_cs_ext::fiber_holder_impl>_&),_void_(*)(const_std::shared_ptr<cs_impl::runtime_cs_ext::fiber_holder_impl>_&)>
             *)((long)&(in_RDI->super__Function_base)._M_functor + 8);
  std::function<void(std::shared_ptr<cs_impl::runtime_cs_ext::fiber_holder_impl>const&)>::
  function<void(*const&)(std::shared_ptr<cs_impl::runtime_cs_ext::fiber_holder_impl>const&),void>
            (in_stack_ffffffffffffffc0,local_30);
  cni_helper<void_(*)(const_std::shared_ptr<cs_impl::runtime_cs_ext::fiber_holder_impl>_&),_void_(*)(const_std::shared_ptr<cs_impl::runtime_cs_ext::fiber_holder_impl>_&)>
  ::cni_helper(this_00,in_RDI);
  std::function<void_(const_std::shared_ptr<cs_impl::runtime_cs_ext::fiber_holder_impl>_&)>::
  ~function((function<void_(const_std::shared_ptr<cs_impl::runtime_cs_ext::fiber_holder_impl>_&)> *)
            0x2edb76);
  return;
}

Assistant:

explicit cni_holder(const T &func) : mCni(func) {}